

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::UpdateWindowParentAndRootLinks
               (ImGuiWindow *window,ImGuiWindowFlags flags,ImGuiWindow *parent_window)

{
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  
  *(long *)(in_RDI + 0x388) = in_RDX;
  *(long *)(in_RDI + 0x3a0) = in_RDI;
  *(long *)(in_RDI + 0x398) = in_RDI;
  *(long *)(in_RDI + 0x390) = in_RDI;
  if (((in_RDX != 0) && ((in_ESI & 0x1000000) != 0)) && ((in_ESI & 0x2000000) == 0)) {
    *(undefined8 *)(in_RDI + 0x390) = *(undefined8 *)(in_RDX + 0x390);
  }
  if (((in_RDX != 0) && ((in_ESI & 0x8000000) == 0)) && ((in_ESI & 0x5000000) != 0)) {
    *(undefined8 *)(in_RDI + 0x398) = *(undefined8 *)(in_RDX + 0x398);
  }
  while( true ) {
    if ((*(uint *)(*(long *)(in_RDI + 0x3a0) + 0xc) & 0x800000) == 0) {
      return;
    }
    if (*(long *)(*(long *)(in_RDI + 0x3a0) + 0x388) == 0) break;
    *(undefined8 *)(in_RDI + 0x3a0) = *(undefined8 *)(*(long *)(in_RDI + 0x3a0) + 0x388);
  }
  __assert_fail("window->RootWindowForNav->ParentWindow != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                ,0x15f4,
                "void ImGui::UpdateWindowParentAndRootLinks(ImGuiWindow *, ImGuiWindowFlags, ImGuiWindow *)"
               );
}

Assistant:

void ImGui::UpdateWindowParentAndRootLinks(ImGuiWindow* window, ImGuiWindowFlags flags, ImGuiWindow* parent_window)
{
    window->ParentWindow = parent_window;
    window->RootWindow = window->RootWindowForTitleBarHighlight = window->RootWindowForNav = window;
    if (parent_window && (flags & ImGuiWindowFlags_ChildWindow) && !(flags & ImGuiWindowFlags_Tooltip))
        window->RootWindow = parent_window->RootWindow;
    if (parent_window && !(flags & ImGuiWindowFlags_Modal) && (flags & (ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_Popup)))
        window->RootWindowForTitleBarHighlight = parent_window->RootWindowForTitleBarHighlight;
    while (window->RootWindowForNav->Flags & ImGuiWindowFlags_NavFlattened)
    {
        IM_ASSERT(window->RootWindowForNav->ParentWindow != NULL);
        window->RootWindowForNav = window->RootWindowForNav->ParentWindow;
    }
}